

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::UniformLocArrayofArrays::Run(UniformLocArrayofArrays *this)

{
  reference pvVar1;
  long lVar2;
  DefOccurence local_848;
  DefOccurence local_844;
  LayoutSpecifierBase local_840;
  LayoutSpecifierBase local_830;
  UniformType local_820;
  Uniform local_790;
  LayoutSpecifierBase local_5b8;
  DefOccurence local_5a8;
  DefOccurence local_5a4;
  LayoutSpecifierBase local_5a0;
  LayoutSpecifierBase local_590;
  UniformType local_580;
  Uniform local_4f0;
  allocator<int> local_311;
  undefined1 local_310 [8];
  vector<int,_std::allocator<int>_> arraySizesSegmented_1;
  DefOccurence local_2e8;
  DefOccurence local_2e4;
  LayoutSpecifierBase local_2e0;
  LayoutSpecifierBase local_2d0;
  UniformType local_2c0;
  Uniform local_230;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> arraySizesSegmented;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocArrayofArrays *this_local;
  
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::allocator<int>::allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,2,&local_41);
  std::allocator<int>::~allocator(&local_41);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  *pvVar1 = 2;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  *pvVar1 = 3;
  UniformType::UniformType(&local_2c0,0x1406,(vector<int,_std::allocator<int>_> *)local_40);
  local_2e0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,Dec);
  local_2d0 = local_2e0;
  DefOccurence::DefOccurence(&local_2e4,ALL_SH);
  DefOccurence::DefOccurence(&local_2e8,ALL_SH);
  arraySizesSegmented_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2d0._0_8_;
  anon_unknown_0::Uniform::Uniform
            (&local_230,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_2c0,(Loc)local_2d0,local_2e4,local_2e8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_230);
  anon_unknown_0::Uniform::~Uniform(&local_230);
  UniformType::~UniformType(&local_2c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::allocator<int>::allocator(&local_311);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_310,2,&local_311);
  std::allocator<int>::~allocator(&local_311);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_310,1);
  *pvVar1 = 2;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_310,0);
  *pvVar1 = 2;
  UniformType::UniformType(&local_580,0x8b51,(vector<int,_std::allocator<int>_> *)local_310);
  local_5a0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(8,Dec);
  local_590 = local_5a0;
  DefOccurence::DefOccurence(&local_5a4,ALL_SH);
  DefOccurence::DefOccurence(&local_5a8,ALL_SH);
  local_5b8 = local_590;
  anon_unknown_0::Uniform::Uniform
            (&local_4f0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_580,(Loc)local_590,local_5a4,local_5a8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_4f0);
  anon_unknown_0::Uniform::~Uniform(&local_4f0);
  UniformType::~UniformType(&local_580);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_310);
  UniformType::UniformType(&local_820,0x1406,0);
  local_840 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0xc,Dec);
  local_830 = local_840;
  DefOccurence::DefOccurence(&local_844,ALL_SH);
  DefOccurence::DefOccurence(&local_848,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_790,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_820,(Loc)local_830,local_844,local_848);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_790);
  anon_unknown_0::Uniform::~Uniform(&local_790);
  UniformType::~UniformType(&local_820);
  lVar2 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform float[2][3]  u0;
		//layout (location = 8) uniform vec3[2][2]   u1;
		//layout (location = 12) uniform float       u2;
		std::vector<Uniform> uniforms;
		{
			std::vector<int> arraySizesSegmented(2);
			arraySizesSegmented[0] = 2;
			arraySizesSegmented[1] = 3;
			uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, arraySizesSegmented), Loc::C(2)));
		}
		{
			std::vector<int> arraySizesSegmented(2);
			arraySizesSegmented[0] = arraySizesSegmented[1] = 2;
			uniforms.push_back(
				Uniform(uniformValueGenerator, UniformType(GL_FLOAT_VEC3, arraySizesSegmented), Loc::C(8)));
		}
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(12)));
		return doRun(uniforms);
	}